

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_38;
  int num;
  
  uStack_38 = (ulong)in_EAX;
  do {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");
    iVar1 = __isoc99_scanf("%d",&num);
    if (iVar1 == 1) {
      if ((num == 0x14) || (num - 5U < 0xb)) {
        puts("Good human!");
        return 0;
      }
    }
    else if (iVar1 == -1) {
      putchar(10);
      return 0;
    }
    puts("The number you entered is not valid!");
    if (iVar1 == 0) {
      __isoc99_scanf("%*[^\n]");
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int num = 0;

  while (true) {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");

    const int res = scanf("%d", &num);
    if (res == 1 && (num == 20 || (num >= 5 && num <= 15))) break;
    else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("The number you entered is not valid!\n");
      if (res == 0) scanf("%*[^\n]");
    }
  }

  printf("Good human!\n");

  return 0;
}